

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableSymbols.cpp
# Opt level: O1

void __thiscall
slang::ast::VariableSymbol::serializeTo(VariableSymbol *this,ASTSerializer *serializer)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ushort uVar2;
  size_t __n;
  string str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  __n = strlen(*(char **)(toString(slang::ast::VariableLifetime)::strings +
                         (long)(int)this->lifetime * 8));
  ASTSerializer::write(serializer,8,"lifetime",__n);
  uVar2 = (this->flags).m_bits;
  if (uVar2 != 0) {
    paVar1 = &local_38.field_2;
    local_38._M_string_length = 0;
    local_38.field_2._M_local_buf[0] = '\0';
    local_38._M_dataplus._M_p = (pointer)paVar1;
    if ((uVar2 & 1) != 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&local_38,"const,");
    }
    if (((this->flags).m_bits & 2) != 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&local_38,"compiler_generated,");
    }
    if (((this->flags).m_bits & 4) != 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&local_38,"imm_cov_option,");
    }
    if (((this->flags).m_bits & 8) != 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&local_38,"formal_cov_sample,");
    }
    if (((this->flags).m_bits & 0x10) != 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&local_38,"checker_free,");
    }
    if (((this->flags).m_bits & 0x20) != 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&local_38,"ref_static,");
    }
    if (local_38._M_string_length != 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
                (&local_38);
      ASTSerializer::write(serializer,5,"flags",(size_t)&local_38);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != paVar1) {
      operator_delete(local_38._M_dataplus._M_p,
                      CONCAT71(local_38.field_2._M_allocated_capacity._1_7_,
                               local_38.field_2._M_local_buf[0]) + 1);
    }
  }
  return;
}

Assistant:

void VariableSymbol::serializeTo(ASTSerializer& serializer) const {
    serializer.write("lifetime", toString(lifetime));

    if (flags) {
        std::string str;
        if (flags.has(VariableFlags::Const))
            str += "const,";
        if (flags.has(VariableFlags::CompilerGenerated))
            str += "compiler_generated,";
        if (flags.has(VariableFlags::ImmutableCoverageOption))
            str += "imm_cov_option,";
        if (flags.has(VariableFlags::CoverageSampleFormal))
            str += "formal_cov_sample,";
        if (flags.has(VariableFlags::CheckerFreeVariable))
            str += "checker_free,";
        if (flags.has(VariableFlags::RefStatic))
            str += "ref_static,";
        if (!str.empty()) {
            str.pop_back();
            serializer.write("flags", str);
        }
    }
}